

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void YUY2ToYRow_C(uint8 *src_yuy2,uint8 *dst_y,int width)

{
  int local_20;
  int x;
  int width_local;
  uint8 *dst_y_local;
  uint8 *src_yuy2_local;
  
  dst_y_local = src_yuy2;
  for (local_20 = 0; local_20 < width + -1; local_20 = local_20 + 2) {
    dst_y[local_20] = *dst_y_local;
    dst_y[local_20 + 1] = dst_y_local[2];
    dst_y_local = dst_y_local + 4;
  }
  if ((width & 1U) != 0) {
    dst_y[width + -1] = *dst_y_local;
  }
  return;
}

Assistant:

void YUY2ToYRow_C(const uint8* src_yuy2, uint8* dst_y, int width) {
  // Output a row of Y values.
  int x;
  for (x = 0; x < width - 1; x += 2) {
    dst_y[x] = src_yuy2[0];
    dst_y[x + 1] = src_yuy2[2];
    src_yuy2 += 4;
  }
  if (width & 1) {
    dst_y[width - 1] = src_yuy2[0];
  }
}